

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

void * calloc(size_t __nmemb,size_t __size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t __size_00;
  void *pvVar3;
  
  if (__nmemb == 0) {
    __size_00 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = __nmemb;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = __size;
    __size_00 = SUB168(auVar1 * auVar2,0);
    if ((0xffff < (__size | __nmemb)) && (SUB168(auVar1 * auVar2,8) != 0)) {
      __size_00 = 0xffffffffffffffff;
    }
  }
  pvVar3 = malloc(__size_00);
  if ((pvVar3 != (void *)0x0) && ((*(byte *)((long)pvVar3 + -8) & 3) != 0)) {
    pvVar3 = memset(pvVar3,0,__size_00);
    return pvVar3;
  }
  return pvVar3;
}

Assistant:

void* dlcalloc(size_t n_elements, size_t elem_size) {
  void* mem;
  size_t req = 0;
  if (n_elements != 0) {
    req = n_elements * elem_size;
    if (((n_elements | elem_size) & ~(size_t)0xffff) &&
        (req / n_elements != elem_size))
      req = MAX_SIZE_T; /* force downstream failure on overflow */
  }
  mem = dlmalloc(req);
  if (mem != 0 && calloc_must_clear(mem2chunk(mem)))
    memset(mem, 0, req);
  return mem;
}